

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
CBlockPolicyEstimator::processBlock
          (CBlockPolicyEstimator *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  long lVar1;
  pointer pRVar2;
  string_view source_file;
  bool bVar3;
  uint uVar4;
  Logger *pLVar5;
  Level level;
  ulong uVar6;
  CBlockPolicyEstimator *this_00;
  RemovedMempoolTransactionInfo *tx;
  pointer tx_00;
  uint uVar7;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *__range1;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *local_118;
  uint local_10c;
  size_t local_108;
  uint local_fc;
  long local_f8;
  uint countedTxs;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock2,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
             ,0x29c,false);
  if (this->nBestSeenHeight < nBlockHeight) {
    this->nBestSeenHeight = nBlockHeight;
    TxConfirmStats::ClearCurrent
              ((this->feeStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,nBlockHeight);
    TxConfirmStats::ClearCurrent
              ((this->shortStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,nBlockHeight);
    uVar6 = (ulong)nBlockHeight;
    TxConfirmStats::ClearCurrent
              ((this->longStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,nBlockHeight);
    TxConfirmStats::UpdateMovingAverages
              ((this->feeStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    TxConfirmStats::UpdateMovingAverages
              ((this->shortStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    this_00 = (CBlockPolicyEstimator *)
              (this->longStats)._M_t.
              super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
              super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
              super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    TxConfirmStats::UpdateMovingAverages((TxConfirmStats *)this_00);
    countedTxs = 0;
    pRVar2 = (txs_removed_for_block->
             super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (tx_00 = (txs_removed_for_block->
                 super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start; level = (Level)uVar6, tx_00 != pRVar2;
        tx_00 = tx_00 + 1) {
      uVar6 = (ulong)nBlockHeight;
      this_00 = this;
      bVar3 = processBlockTx(this,nBlockHeight,tx_00);
      if (bVar3) {
        uVar7 = uVar7 + 1;
        countedTxs = uVar7;
      }
    }
    if (this->firstRecordedHeight == 0 && uVar7 != 0) {
      this->firstRecordedHeight = this->nBestSeenHeight;
      bVar3 = ::LogAcceptCategory((LogFlags)this_00,level);
      if (bVar3) {
        this_00 = (CBlockPolicyEstimator *)0xc;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_00._M_len = 0x58;
        logging_function_00._M_str = "processBlock";
        logging_function_00._M_len = 0xc;
        level = 0xcccd27;
        LogPrintf_<unsigned_int>
                  (logging_function_00,source_file_00,0x2be,
                   IPC|I2P|QT|COINDB|PROXY|PRUNE|REINDEX|SELECTCOINS|ESTIMATEFEE|ZMQ|BENCH|MEMPOOL,
                   (Level)&this->firstRecordedHeight,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffed8);
      }
    }
    bVar3 = ::LogAcceptCategory((LogFlags)this_00,level);
    if (bVar3) {
      local_f8 = ((long)(txs_removed_for_block->
                        super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(txs_removed_for_block->
                       super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x28;
      local_fc = this->untrackedTxs + this->trackedTxs;
      local_108 = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_10c = MaxUsableEstimate(this);
      uVar7 = HistoricalBlockSpan(this);
      uVar4 = BlockSpan(this);
      local_118 = "current";
      if (uVar4 < uVar7) {
        local_118 = "historical";
      }
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar5);
      if (bVar3) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::
        format<unsigned_int,unsigned_long,unsigned_int,unsigned_int,unsigned_long,unsigned_int,char_const*>
                  (&local_78,
                   (tinyformat *)
                   "Blockpolicy estimates updated by %u of %u block txs, since last block %u of %u tracked, mempool map size %u, max target %u from %s\n"
                   ,(char *)&countedTxs,(uint *)&local_f8,(unsigned_long *)&this->trackedTxs,
                   &local_fc,(uint *)&local_108,(unsigned_long *)&local_10c,(uint *)&local_118,
                   (char **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar5 = LogInstance();
        local_78._M_dataplus._M_p = &DAT_00000058;
        local_78._M_string_length = 0xccc4d7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file._M_len = 0x58;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "processBlock";
        logging_function._M_len = 0xc;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x2c4,ESTIMATEFEE,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
    this->trackedTxs = 0;
    this->untrackedTxs = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::processBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block,
                                         unsigned int nBlockHeight)
{
    LOCK(m_cs_fee_estimator);
    if (nBlockHeight <= nBestSeenHeight) {
        // Ignore side chains and re-orgs; assuming they are random
        // they don't affect the estimate.
        // And if an attacker can re-org the chain at will, then
        // you've got much bigger problems than "attacker can influence
        // transaction fees."
        return;
    }

    // Must update nBestSeenHeight in sync with ClearCurrent so that
    // calls to removeTx (via processBlockTx) correctly calculate age
    // of unconfirmed txs to remove from tracking.
    nBestSeenHeight = nBlockHeight;

    // Update unconfirmed circular buffer
    feeStats->ClearCurrent(nBlockHeight);
    shortStats->ClearCurrent(nBlockHeight);
    longStats->ClearCurrent(nBlockHeight);

    // Decay all exponential averages
    feeStats->UpdateMovingAverages();
    shortStats->UpdateMovingAverages();
    longStats->UpdateMovingAverages();

    unsigned int countedTxs = 0;
    // Update averages with data points from current block
    for (const auto& tx : txs_removed_for_block) {
        if (processBlockTx(nBlockHeight, tx))
            countedTxs++;
    }

    if (firstRecordedHeight == 0 && countedTxs > 0) {
        firstRecordedHeight = nBestSeenHeight;
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy first recorded height %u\n", firstRecordedHeight);
    }


    LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy estimates updated by %u of %u block txs, since last block %u of %u tracked, mempool map size %u, max target %u from %s\n",
             countedTxs, txs_removed_for_block.size(), trackedTxs, trackedTxs + untrackedTxs, mapMemPoolTxs.size(),
             MaxUsableEstimate(), HistoricalBlockSpan() > BlockSpan() ? "historical" : "current");

    trackedTxs = 0;
    untrackedTxs = 0;
}